

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

shared_ptr<const_QGradientCache::CacheInfo> __thiscall
QGradientCache::addCacheElement
          (QGradientCache *this,quint64 hash_val,QGradient *gradient,int opacity)

{
  long lVar1;
  iterator __x;
  const_iterator it;
  int iVar2;
  uint uVar3;
  qsizetype qVar4;
  element_type *peVar5;
  QGradient *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QGradientCache *in_RSI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_QGradientCache::CacheInfo> sVar6;
  int unaff_retaddr;
  int unaff_retaddr_00;
  QRgba64 *in_stack_00000008;
  QGradient *in_stack_00000010;
  QGradientCache *in_stack_00000018;
  int i;
  shared_ptr<QGradientCache::CacheInfo> cache_entry;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *in_stack_fffffffffffffe98;
  QRandomGenerator *in_stack_fffffffffffffea0;
  QGradient *in_stack_fffffffffffffea8;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>
  *in_stack_fffffffffffffeb0;
  QList<std::pair<double,_QColor>_> *in_stack_fffffffffffffeb8;
  iterator *this_00;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>
  *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  iterator local_c0;
  InterpolationMode local_a4;
  undefined1 *local_88;
  undefined1 *local_80;
  iterator local_48;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *in_stack_ffffffffffffffd0;
  QRandomGenerator *in_stack_ffffffffffffffd8;
  QGradient *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::size
                    (&in_RSI->cache);
  iVar2 = maxCacheSize(in_RSI);
  if (qVar4 == iVar2) {
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::begin
              (in_stack_fffffffffffffec0);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    QRandomGenerator::global();
    maxCacheSize(in_RSI);
    QRandomGenerator::bounded(in_stack_fffffffffffffea0,iVar2);
    __x.i.bucket = in_stack_fffffffffffffec8;
    __x.i.d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               *)in_stack_fffffffffffffec0;
    __x.e._0_4_ = in_stack_fffffffffffffed0;
    __x.e._4_4_ = in_stack_fffffffffffffed4;
    std::
    next<QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::iterator>
              (__x,(difference_type)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffe98 = in_stack_ffffffffffffffd0;
    in_stack_fffffffffffffea0 = in_stack_ffffffffffffffd8;
    in_stack_fffffffffffffea8 = in_stack_ffffffffffffffe0;
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::
    const_iterator::const_iterator((const_iterator *)&stack0xffffffffffffffd0,&local_48);
    it.i.bucket = (size_t)in_stack_fffffffffffffea0;
    it.i.d = in_stack_fffffffffffffe98;
    it.e = (Chain **)in_stack_fffffffffffffea8;
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::erase
              ((QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),it);
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QGradient::stops(in_stack_fffffffffffffea8);
  local_a4 = QGradient::interpolationMode(in_RCX);
  std::
  make_shared<QGradientCache::CacheInfo,QList<std::pair<double,QColor>>,int&,QGradient::InterpolationMode>
            (in_stack_fffffffffffffeb8,(int *)in_stack_fffffffffffffeb0,
             &in_stack_fffffffffffffea8->m_type);
  QList<std::pair<double,_QColor>_>::~QList((QList<std::pair<double,_QColor>_> *)0x57d939);
  std::__shared_ptr_access<QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x57d953);
  paletteSize(in_RSI);
  generateGradientColorTable
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  for (iVar2 = 0; iVar2 < 0x400; iVar2 = iVar2 + 1) {
    peVar5 = std::
             __shared_ptr_access<QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x57d99f);
    uVar3 = QRgba64::toArgb32(peVar5->buffer64 + iVar2);
    peVar5 = std::
             __shared_ptr_access<QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x57d9c4);
    peVar5->buffer32[iVar2] = uVar3;
  }
  std::shared_ptr<QGradientCache::CacheInfo_const>::shared_ptr<QGradientCache::CacheInfo,void>
            ((shared_ptr<const_QGradientCache::CacheInfo> *)in_stack_fffffffffffffea0,
             (shared_ptr<QGradientCache::CacheInfo> *)in_stack_fffffffffffffe98);
  this_00 = &local_c0;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::insert
            (in_stack_fffffffffffffeb0,(unsigned_long_long *)in_stack_fffffffffffffea8,
             (shared_ptr<const_QGradientCache::CacheInfo> *)in_stack_fffffffffffffea0);
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::iterator::value
            (this_00);
  std::shared_ptr<const_QGradientCache::CacheInfo>::shared_ptr
            ((shared_ptr<const_QGradientCache::CacheInfo> *)in_stack_fffffffffffffea0,
             (shared_ptr<const_QGradientCache::CacheInfo> *)in_stack_fffffffffffffe98);
  std::shared_ptr<const_QGradientCache::CacheInfo>::~shared_ptr
            ((shared_ptr<const_QGradientCache::CacheInfo> *)0x57da45);
  std::shared_ptr<QGradientCache::CacheInfo>::~shared_ptr
            ((shared_ptr<QGradientCache::CacheInfo> *)0x57da4f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar6.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         in_RDI;
    return (shared_ptr<const_QGradientCache::CacheInfo>)
           sVar6.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CacheInfo> addCacheElement(quint64 hash_val, const QGradient &gradient, int opacity) {
        if (cache.size() == maxCacheSize()) {
            // may remove more than 1, but OK
            cache.erase(std::next(cache.begin(), QRandomGenerator::global()->bounded(maxCacheSize())));
        }
        auto cache_entry = std::make_shared<CacheInfo>(gradient.stops(), opacity, gradient.interpolationMode());
        generateGradientColorTable(gradient, cache_entry->buffer64, paletteSize(), opacity);
        for (int i = 0; i < GRADIENT_STOPTABLE_SIZE; ++i)
            cache_entry->buffer32[i] = cache_entry->buffer64[i].toArgb32();
        return cache.insert(hash_val, std::move(cache_entry)).value();
    }